

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
* __thiscall
gnuplotio::
get_columns_range<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>
          (VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>
           *__return_storage_ptr__,gnuplotio *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *arg)

{
  range_type outer;
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
  rvec;
  IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_58;
  subiter_type local_48;
  _Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
  local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.end._M_current = *(vector<double,_std::allocator<double>_> **)(this + 8);
  for (local_58.it._M_current = *(vector<double,_std::allocator<double>_> **)this;
      local_58.it._M_current != local_58.end._M_current;
      local_58.it._M_current = local_58.it._M_current + 1) {
    local_48 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
               ::deref_subiter(&local_58);
    std::
    vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>>
    ::
    emplace_back<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>
              ((vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>>>
                *)&local_38,&local_48);
  }
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
  ::vector(&__return_storage_ptr__->rvec,
           (vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
            *)&local_38);
  std::
  _Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>_>_>
  ::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

VecOfRange<typename ArrayTraits<T>::range_type::subiter_type>
get_columns_range(const T &arg) {
    typedef typename ArrayTraits<T>::range_type::subiter_type U;
    std::vector<U> rvec;
    typename ArrayTraits<T>::range_type outer = ArrayTraits<T>::get_range(arg);
    while(!outer.is_end()) {
        rvec.push_back(outer.deref_subiter());
        outer.inc();
    }
    VecOfRange<U> ret(rvec);
    return ret;
}